

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Node<QNetworkRequest::KnownHeaders,_QVariant> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::insert
          (Span<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *this,size_t i)

{
  long lVar1;
  byte bVar2;
  
  bVar2 = this->nextFree;
  if (bVar2 == this->allocated) {
    addStorage(this);
    bVar2 = this->nextFree;
  }
  lVar1 = (ulong)((uint)bVar2 * 8) * 5;
  this->nextFree = (this->entries->storage).data[lVar1];
  this->offsets[i] = bVar2;
  return (Node<QNetworkRequest::KnownHeaders,_QVariant> *)((this->entries->storage).data + lVar1);
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }